

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::LoopSetInst::Exec
          (LoopSetInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  Label beginLabel;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  undefined4 *puVar5;
  RewindLoopSetCont *this_01;
  bool local_75;
  uint local_74;
  CharCount inputEndOffset;
  CharCountOrFlag repeatsUpper;
  CharCount loopMatchStart;
  RuntimeCharSet<char16_t> *matchSet;
  LoopInfo *loopInfo;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  LoopSetInst *this_local;
  
  origLoopInfo = Matcher::LoopIdToLoopInfo(matcher,(this->super_BeginLoopBasicsMixin).loopId);
  if (((this->super_BeginLoopBasicsMixin).hasOuterLoops & 1U) != 0) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopBasicsMixin).loopId,origLoopInfo,matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  origLoopInfo->startInputOffset = *inputOffset;
  CVar1 = *inputOffset;
  uVar2 = (this->super_BeginLoopBasicsMixin).repeats.upper;
  local_74 = inputLength;
  if (uVar2 < inputLength - *inputOffset) {
    local_74 = *inputOffset + uVar2;
  }
  Matcher::CompStats(matcher);
  while( true ) {
    local_75 = false;
    if (*inputOffset < local_74) {
      local_75 = RuntimeCharSet<char16_t>::Get
                           (&(this->super_SetMixin<false>).set,input[*inputOffset]);
    }
    if (local_75 == false) break;
    Matcher::CompStats(matcher);
    *inputOffset = *inputOffset + 1;
  }
  origLoopInfo->number = *inputOffset - CVar1;
  if (origLoopInfo->number < (this->super_BeginLoopBasicsMixin).repeats.lower) {
    this_local._7_1_ =
         Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    if ((this->super_BeginLoopBasicsMixin).repeats.lower < origLoopInfo->number) {
      if ((LoopSetInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xd75,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_01 = (RewindLoopSetCont *)
                ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
                Push<UnifiedRegex::RewindLoopSetCont>
                          (&contStack->
                            super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      beginLabel = Matcher::InstPointerToLabel(matcher,*instPointer);
      RewindLoopSetCont::RewindLoopSetCont(this_01,beginLabel);
      Matcher::PushStats(matcher,contStack,input);
    }
    *instPointer = *instPointer + 0x36;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool LoopSetInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop is contained in an outer loop, continuation stack may already have a RewindLoopFixed entry for
        // this loop. We must make sure it's state is preserved on backtrack.
        if (hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // startInputOffset will stay here for all iterations, and we'll use number of length to figure out
        // where in the input to rewind to
        loopInfo->startInputOffset = inputOffset;

        // Consume as many elements of set as possible
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        loopInfo->number = inputOffset - loopMatchStart;
        if (loopInfo->number < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (loopInfo->number > repeats.lower)
        {
            // CHOICEPOINT: If follow fails, try consuming one fewer characters
            Assert(instPointer == (uint8*)this);
            PUSH(contStack, RewindLoopSetCont, matcher.InstPointerToLabel(instPointer));
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        // else: failure of follow signals failure of entire loop

        // Continue with follow
        instPointer += sizeof(*this);
        return false;
    }